

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingScheme.h
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::EncodingScheme::EncodingScheme(EncodingScheme *this,EncodingScheme *param_1)

{
  KUINT16 KVar1;
  EncodingScheme *param_1_local;
  EncodingScheme *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EncodingScheme_00331aa8;
  KVar1 = param_1->m_ui16TDLType;
  this->m_EncodingSchemeUnion = param_1->m_EncodingSchemeUnion;
  this->m_ui16TDLType = KVar1;
  return;
}

Assistant:

class KDIS_EXPORT EncodingScheme : public DataTypeBase
{
protected:

    union
    {
        struct
        {
            KUINT16 m_ui16Type  : 14;
            KUINT16 m_ui16Class : 2;
        };
        KUINT16 m_ui16EncodingScheme;
    } m_EncodingSchemeUnion;

    KUINT16 m_ui16TDLType;

public:

    static const KUINT16 ENCODING_SCHEME_SIZE = 4;

    EncodingScheme();

    EncodingScheme(KDataStream &stream) noexcept(false);

    EncodingScheme( KDIS::DATA_TYPE::ENUMS::EncodingClass EC, KUINT16 EncodingType, KDIS::DATA_TYPE::ENUMS::TDLType T );

    EncodingScheme( KDIS::DATA_TYPE::ENUMS::EncodingType Audio, KDIS::DATA_TYPE::ENUMS::TDLType T );

    virtual ~EncodingScheme();

    //************************************
    // FullName:    KDIS::DATA_TYPE::EncodingScheme::SetEncodingClass
    //              KDIS::DATA_TYPE::EncodingScheme::GetEncodingClass
    // Description: Encoding Class
    // Parameter:   EncodingClass EC
    //************************************
    void SetEncodingClass( KDIS::DATA_TYPE::ENUMS::EncodingClass EC );
    KDIS::DATA_TYPE::ENUMS::EncodingClass GetEncodingClass() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EncodingScheme::SetEncodingTypeAudio
    //              KDIS::DATA_TYPE::EncodingScheme::SetEncodingType
	//              KDIS::DATA_TYPE::EncodingScheme::GetEncodingTypeAudio
	//              KDIS::DATA_TYPE::EncodingScheme::GetEncodingType
    // Description: When using encoded audio use an encoding type.
    //              Can also be used to represent the number of TDL
    //              (Tactical Data Links). If encoded class is not audio
    //              and the TDL type is 0 then this value should also be 0.
    // Parameter:   EncodingType T, KUINT16 T
    //************************************
    void SetEncodingTypeAudio( KDIS::DATA_TYPE::ENUMS::EncodingType T );
    void SetEncodingType( KUINT16 T );
    KDIS::DATA_TYPE::ENUMS::EncodingType GetEncodingTypeAudio() const;
    KUINT16 GetEncodingType() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EncodingScheme::SetTDLType
    //              KDIS::DATA_TYPE::EncodingScheme::GetTDLType
    // Description: Tactical Data Link Type if the encoding class is
    //              representing a TDL type, if not then set to 0.
    // Parameter:   TDLType T
    //************************************
    void SetTDLType( KDIS::DATA_TYPE::ENUMS::TDLType T );
    KDIS::DATA_TYPE::ENUMS::TDLType GetTDLType() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EncodingScheme::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EncodingScheme::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::EncodingScheme::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const EncodingScheme & Value ) const;
    KBOOL operator != ( const EncodingScheme & Value ) const;
}